

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_low_entropy(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  uVar2 = bits_ask(strm,1);
  if (uVar2 != 0) {
    uVar3 = bits_get(strm,1);
    piVar1->id = uVar3;
    bits_drop(strm,1);
    piVar1->mode = m_low_entropy_ref;
  }
  strm_local._4_4_ = (uint)(uVar2 != 0);
  return strm_local._4_4_;
}

Assistant:

static int m_low_entropy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (bits_ask(strm, 1) == 0)
        return M_EXIT;
    state->id = bits_get(strm, 1);
    bits_drop(strm, 1);
    state->mode = m_low_entropy_ref;
    return M_CONTINUE;
}